

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KDReportsXmlParser.cpp
# Opt level: O0

QString * __thiscall
KDReports::XmlParser::extractText
          (QString *__return_storage_ptr__,XmlParser *this,QDomElement *element,QString *pId,
          QAbstractItemModel *currentModel,int currentRow)

{
  qsizetype *this_00;
  int iVar1;
  QAbstractItemModel *pQVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  QString *pQVar6;
  QVariant local_348;
  QModelIndex local_328;
  undefined1 local_310 [8];
  QModelIndex index;
  QArrayDataPointer<char16_t> local_2e0;
  QString local_2c8;
  QString local_2b0;
  int local_294;
  undefined1 local_290 [4];
  int column;
  QArrayDataPointer<char16_t> local_278;
  QString local_260;
  QString local_248;
  int local_22c;
  QAbstractItemModel *pQStack_228;
  int row;
  QAbstractItemModel *model;
  QArrayDataPointer<char16_t> local_208;
  QString local_1f0;
  undefined1 local_1d8 [8];
  QString modelName;
  QString local_1a8;
  uint local_18c;
  piter local_188;
  undefined1 local_178 [8];
  const_iterator it;
  QArrayDataPointer<char16_t> local_150;
  QString local_138;
  undefined1 local_120 [8];
  QString id;
  QArrayDataPointer<char16_t> local_f8;
  QString local_e0;
  int local_c4;
  QAbstractItemModel *pQStack_c0;
  int currentRow_local;
  QAbstractItemModel *currentModel_local;
  QString *pId_local;
  QDomElement *element_local;
  XmlParser *this_local;
  char16_t *local_98;
  char16_t *str_4;
  QArrayDataPointer<char16_t> *local_88;
  char16_t *local_80;
  char16_t *str_5;
  QArrayDataPointer<char16_t> *local_70;
  char16_t *local_68;
  char16_t *str_3;
  QArrayDataPointer<char16_t> *local_58;
  char16_t *local_50;
  char16_t *str_2;
  qsizetype *local_40;
  char16_t *local_38;
  char16_t *str_1;
  QArrayDataPointer<char16_t> *local_28;
  char16_t *local_20;
  char16_t *str;
  QArrayDataPointer<char16_t> *local_10;
  
  str = L"id";
  local_20 = L"id";
  local_c4 = currentRow;
  pQStack_c0 = currentModel;
  currentModel_local = (QAbstractItemModel *)pId;
  pId_local = (QString *)element;
  element_local = (QDomElement *)this;
  this_local = (XmlParser *)__return_storage_ptr__;
  local_10 = &local_f8;
  QArrayDataPointer<char16_t>::QArrayDataPointer(&local_f8,(Data *)0x0,L"id",2);
  QString::QString(&local_e0,&local_f8);
  bVar3 = QDomElement::hasAttribute((QString *)element);
  QString::~QString(&local_e0);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_f8);
  pQVar6 = pId_local;
  if ((bVar3 & 1) == 0) {
    this_00 = &modelName.d.size;
    str_2 = L"model";
    local_50 = L"model";
    local_40 = this_00;
    QArrayDataPointer<char16_t>::QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)this_00,(Data *)0x0,L"model",5);
    QString::QString(&local_1a8,(DataPointer *)this_00);
    bVar3 = QDomElement::hasAttribute((QString *)pQVar6);
    QString::~QString(&local_1a8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer
              ((QArrayDataPointer<char16_t> *)&modelName.d.size);
    pQVar6 = pId_local;
    if ((bVar3 & 1) == 0) goto LAB_0017de9d;
    str_3 = L"model";
    local_68 = L"model";
    local_58 = &local_208;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_208,(Data *)0x0,L"model",5);
    QString::QString(&local_1f0,&local_208);
    QString::QString((QString *)&model);
    QDomElement::attribute((QString *)local_1d8,(QString *)pQVar6);
    QString::~QString((QString *)&model);
    QString::~QString(&local_1f0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_208);
    pQStack_228 = modelForKey((QString *)local_1d8);
    pQVar6 = pId_local;
    if (pQStack_228 == (QAbstractItemModel *)0x0) {
      local_18c = 0;
    }
    else {
      if ((pQStack_228 == pQStack_c0) && (-1 < local_c4)) {
        local_22c = local_c4;
      }
      else {
        local_88 = &local_278;
        str_4 = L"row";
        local_98 = L"row";
        QArrayDataPointer<char16_t>::QArrayDataPointer(&local_278,(Data *)0x0,L"row",3);
        QString::QString(&local_260,&local_278);
        QString::QString((QString *)local_290);
        QDomElement::attribute((QString *)&local_248,(QString *)pQVar6);
        local_22c = QString::toInt(&local_248,(bool *)0x0,10);
        QString::~QString(&local_248);
        QString::~QString((QString *)local_290);
        QString::~QString(&local_260);
        QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_278);
      }
      pQVar6 = pId_local;
      local_70 = &local_2e0;
      str_5 = L"column";
      local_80 = L"column";
      QArrayDataPointer<char16_t>::QArrayDataPointer(&local_2e0,(Data *)0x0,L"column",6);
      QString::QString(&local_2c8,&local_2e0);
      QString::QString((QString *)&index.m);
      QDomElement::attribute((QString *)&local_2b0,(QString *)pQVar6);
      iVar5 = QString::toInt(&local_2b0,(bool *)0x0,10);
      QString::~QString(&local_2b0);
      QString::~QString((QString *)&index.m);
      QString::~QString(&local_2c8);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_2e0);
      pQVar2 = pQStack_228;
      iVar1 = local_22c;
      local_294 = iVar5;
      QModelIndex::QModelIndex(&local_328);
      (**(code **)(*(long *)pQVar2 + 0x60))(local_310,pQVar2,iVar1,iVar5,&local_328);
      (**(code **)(*(long *)pQStack_228 + 0x90))(&local_348,pQStack_228,local_310,0);
      QVariant::toString();
      QVariant::~QVariant(&local_348);
      local_18c = 1;
    }
    QString::~QString((QString *)local_1d8);
  }
  else {
    str_1 = L"id";
    local_38 = L"id";
    local_28 = &local_150;
    QArrayDataPointer<char16_t>::QArrayDataPointer(&local_150,(Data *)0x0,L"id",2);
    QString::QString(&local_138,&local_150);
    QString::QString((QString *)&it.i.bucket);
    QDomElement::attribute((QString *)local_120,(QString *)pQVar6);
    QString::~QString((QString *)&it.i.bucket);
    QString::~QString(&local_138);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_150);
    QString::operator=((QString *)currentModel_local,(QString *)local_120);
    _local_178 = (piter)QHash<QString,_QString>::find(&this->m_textValues,(QString *)local_120);
    local_188 = (piter)QHash<QString,_QString>::end(&this->m_textValues);
    bVar4 = QHash<QString,_QString>::const_iterator::operator!=
                      ((const_iterator *)local_178,(const_iterator *)&local_188);
    if (bVar4) {
      pQVar6 = QHash<QString,_QString>::const_iterator::operator*((const_iterator *)local_178);
      QString::QString(__return_storage_ptr__,pQVar6);
    }
    local_18c = (uint)bVar4;
    QString::~QString((QString *)local_120);
  }
  if (local_18c != 0) {
    return __return_storage_ptr__;
  }
LAB_0017de9d:
  QDomElement::text();
  return __return_storage_ptr__;
}

Assistant:

QString KDReports::XmlParser::extractText(const QDomElement &element, QString *pId, const QAbstractItemModel *currentModel, int currentRow) const
{
    if (element.hasAttribute(QStringLiteral("id"))) {
        const QString id = element.attribute(QStringLiteral("id"));
        *pId = id;
        const QHash<QString, QString>::const_iterator it = m_textValues.find(id);
        if (it != m_textValues.end()) {
            return *it;
        }
    } else if (element.hasAttribute(QStringLiteral("model"))) {
        const QString modelName = element.attribute(QStringLiteral("model"));
        QAbstractItemModel *model = KDReports::modelForKey(modelName);
        if (model) {
            int row;
            if (model == currentModel && currentRow > -1) {
                row = currentRow;
            } else {
                row = element.attribute(QStringLiteral("row")).toInt();
            }
            const int column = element.attribute(QStringLiteral("column")).toInt();
            const QModelIndex index = model->index(row, column);
            return model->data(index).toString();
        }
    }

    return element.text();
}